

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsResub.c
# Opt level: O0

void Abc_NtkMfsUpdateNetwork(Mfs_Man_t *p,Abc_Obj_t *pObj,Vec_Ptr_t *vMfsFanins,Hop_Obj_t *pFunc)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pFanin_00;
  int local_3c;
  int k;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObjNew;
  Hop_Obj_t *pFunc_local;
  Vec_Ptr_t *vMfsFanins_local;
  Abc_Obj_t *pObj_local;
  Mfs_Man_t *p_local;
  
  pObj_00 = Abc_NtkCreateNode(pObj->pNtk);
  (pObj_00->field_5).pData = pFunc;
  for (local_3c = 0; iVar1 = Vec_PtrSize(vMfsFanins), local_3c < iVar1; local_3c = local_3c + 1) {
    pFanin_00 = (Abc_Obj_t *)Vec_PtrEntry(vMfsFanins,local_3c);
    Abc_ObjAddFanin(pObj_00,pFanin_00);
  }
  Abc_NtkUpdate(pObj,pObj_00,p->vLevels);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////
 
/**Function*************************************************************

  Synopsis    [Updates the network after resubstitution.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Abc_NtkMfsUpdateNetwork( Mfs_Man_t * p, Abc_Obj_t * pObj, Vec_Ptr_t * vMfsFanins, Hop_Obj_t * pFunc )
{
    Abc_Obj_t * pObjNew, * pFanin;
    int k;
    // create the new node
    pObjNew = Abc_NtkCreateNode( pObj->pNtk );
    pObjNew->pData = pFunc;
    Vec_PtrForEachEntry( Abc_Obj_t *, vMfsFanins, pFanin, k )
        Abc_ObjAddFanin( pObjNew, pFanin );
    // replace the old node by the new node
//printf( "Replacing node " ); Abc_ObjPrint( stdout, pObj );
//printf( "Inserting node " ); Abc_ObjPrint( stdout, pObjNew );
    // update the level of the node
    Abc_NtkUpdate( pObj, pObjNew, p->vLevels );
}